

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O3

void Timidity::mix_voice(Renderer *song,float *buf,Voice *v,int c)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  BYTE BVar4;
  int iVar5;
  undefined8 in_RAX;
  float *sp;
  sample_t *psVar6;
  long lVar7;
  int iVar8;
  SDWORD control_ratio;
  final_volume_t *ampat;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int count;
  uint local_38;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  _local_38 = CONCAT44(local_34,c);
  if (c < 0) {
    return;
  }
  if ((v->status & 8) != 0) {
    if (0x13 < (uint)c) {
      _local_38 = CONCAT44(local_34,0x14);
    }
    psVar6 = resample_voice(song,v,(int *)&local_38);
    uVar9 = 1;
    if (1 < local_38) {
      uVar9 = local_38;
    }
    fVar11 = v->left_mix;
    fVar13 = v->right_mix;
    if (fVar13 == 0.0) {
      fVar13 = -fVar11;
      uVar10 = -(uint)(fVar13 / (float)(int)uVar9 == 0.0);
      lVar7 = 0;
      do {
        fVar11 = fVar11 + (float)(uVar10 & 0xbf800000 | ~uVar10 & (uint)(fVar13 / (float)(int)uVar9)
                                 );
        if (fVar11 < 0.0) break;
        buf[lVar7 * 2] = psVar6[lVar7] * fVar11 + buf[lVar7 * 2];
        lVar7 = lVar7 + 1;
      } while (local_38 + (local_38 == 0) != (int)lVar7);
    }
    else if (fVar11 == 0.0) {
      fVar11 = -fVar13 / (float)(int)uVar9;
      uVar9 = -(uint)(fVar11 == 0.0);
      lVar7 = 0;
      do {
        fVar13 = fVar13 + (float)(uVar9 & 0xbf800000 | ~uVar9 & (uint)fVar11);
        if (fVar13 < 0.0) break;
        buf[lVar7 * 2 + 1] = psVar6[lVar7 * 2 + 1] * fVar13 + buf[lVar7 * 2 + 1];
        lVar7 = lVar7 + 1;
      } while (local_38 + (local_38 == 0) != (int)lVar7);
    }
    else {
      fVar12 = 1.0 / (float)(int)uVar9;
      fVar14 = -fVar11 * fVar12;
      uVar9 = -(uint)(fVar14 == 0.0);
      fVar12 = fVar12 * fVar13;
      lVar7 = 0;
      do {
        fVar13 = fVar13 - fVar12;
        fVar11 = fVar11 + (float)(uVar9 & 0xbf800000 | ~uVar9 & (uint)fVar14);
        if (0.0 <= fVar11) {
          if (fVar13 < 0.0) {
            fVar13 = 0.0;
          }
        }
        else {
          fVar11 = 0.0;
          if (fVar13 < 0.0) break;
        }
        fVar1 = psVar6[lVar7];
        buf[lVar7 * 2] = fVar1 * fVar11 + buf[lVar7 * 2];
        buf[lVar7 * 2 + 1] = fVar1 * fVar13 + buf[lVar7 * 2 + 1];
        lVar7 = lVar7 + 1;
      } while (local_38 + (local_38 == 0) != (int)lVar7);
    }
    v->status = '\0';
    return;
  }
  sp = resample_voice(song,v,(int *)&local_38);
  uVar9 = local_38;
  if ((int)local_38 < 0) {
    return;
  }
  fVar11 = v->right_mix;
  if (fVar11 == 0.0) {
    if (((v->eg1).field_0.env.bUpdating == '\0') && (v->tremolo_phase_increment == 0)) {
      if (local_38 != 0) {
        fVar11 = v->left_mix;
        lVar7 = 0;
        do {
          buf[lVar7 * 2] = sp[lVar7] * fVar11 + buf[lVar7 * 2];
          lVar7 = lVar7 + 1;
        } while (local_38 != (uint)lVar7);
      }
      goto LAB_003553d8;
    }
    control_ratio = song->control_ratio;
    ampat = &v->left_mix;
  }
  else {
    fVar13 = v->left_mix;
    BVar4 = (v->eg1).field_0.env.bUpdating;
    if (fVar13 != 0.0) {
      if ((BVar4 == '\0') && (v->tremolo_phase_increment == 0)) {
        if (local_38 != 0) {
          lVar7 = 0;
          do {
            *(ulong *)(buf + lVar7 * 2) =
                 CONCAT44((float)((ulong)*(undefined8 *)(buf + lVar7 * 2) >> 0x20) +
                          sp[lVar7] * fVar11,
                          (float)*(undefined8 *)(buf + lVar7 * 2) + sp[lVar7] * fVar13);
            lVar7 = lVar7 + 1;
          } while (local_38 != (uint)lVar7);
        }
      }
      else {
        _local_38 = CONCAT44(song->control_ratio,local_38);
        iVar8 = v->control_counter;
        if (v->control_counter != 0) goto LAB_00355563;
        iVar5 = update_signal(v);
        while (iVar8 = local_34, iVar5 == 0) {
LAB_00355563:
          if (uVar9 == 0) break;
          uVar2 = v->left_mix;
          uVar3 = v->right_mix;
          iVar5 = iVar8;
          if ((int)uVar9 <= iVar8) {
            v->control_counter = iVar8 - uVar9;
            lVar7 = 0;
            do {
              *(ulong *)(buf + lVar7 * 2) =
                   CONCAT44((float)((ulong)*(undefined8 *)(buf + lVar7 * 2) >> 0x20) +
                            sp[lVar7] * (float)uVar3,
                            (float)*(undefined8 *)(buf + lVar7 * 2) + sp[lVar7] * (float)uVar2);
              lVar7 = lVar7 + 1;
            } while (uVar9 != (uint)lVar7);
            break;
          }
          for (; iVar5 != 0; iVar5 = iVar5 + -1) {
            *(ulong *)buf =
                 CONCAT44((float)((ulong)*(undefined8 *)buf >> 0x20) + *sp * (float)uVar3,
                          (float)*(undefined8 *)buf + *sp * (float)uVar2);
            buf = buf + 2;
            sp = sp + 1;
          }
          uVar9 = uVar9 - iVar8;
          iVar5 = update_signal(v);
        }
      }
      goto LAB_003553d8;
    }
    if ((BVar4 == '\0') && (v->tremolo_phase_increment == 0)) {
      if (local_38 != 0) {
        lVar7 = 0;
        do {
          buf[lVar7 * 2 + 1] = sp[lVar7] * fVar11 + buf[lVar7 * 2 + 1];
          lVar7 = lVar7 + 1;
        } while (local_38 != (uint)lVar7);
      }
      goto LAB_003553d8;
    }
    ampat = &v->right_mix;
    control_ratio = song->control_ratio;
    buf = buf + 1;
  }
  mix_single_signal(control_ratio,sp,buf,v,ampat,local_38);
LAB_003553d8:
  v->sample_count = v->sample_count + local_38;
  return;
}

Assistant:

void mix_voice(Renderer *song, float *buf, Voice *v, int c)
{
	int count = c;
	sample_t *sp;
	if (c < 0)
	{
		return;
	}
	if (v->status & VOICE_STOPPING)
	{
		if (count >= MAX_DIE_TIME)
			count = MAX_DIE_TIME;
		sp = resample_voice(song, v, &count);
		ramp_out(sp, buf, v, count);
		v->status = 0;
	}
	else
	{
		sp = resample_voice(song, v, &count);
		if (count < 0)
		{
			return;
		}
		if (v->right_mix == 0)			// All the way to the left
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment != 0)
			{
				mix_single_left_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_single_left(sp, buf, v, count);
			}
		}
		else if (v->left_mix == 0)		// All the way to the right
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment != 0)
			{
				mix_single_right_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_single_right(sp, buf, v, count);
			}
		}
		else							// Somewhere in the middle
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment)
			{
				mix_mystery_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_mystery(song->control_ratio, sp, buf, v, count);
			}
		}
		v->sample_count += count;
	}
}